

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O3

void req0_ctx_recv(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  long lVar1;
  nni_msg *msg;
  _Bool _Var2;
  size_t count;
  nng_err result;
  
  lVar1 = *arg;
  mtx = (nni_mtx *)(lVar1 + 0x358);
  nni_mtx_lock(mtx);
  if (*(long *)((long)arg + 0x50) != 0) {
LAB_00121592:
    result = NNG_ESTATE;
    if (*(char *)((long)arg + 0x88) == '\x01') {
      *(undefined1 *)((long)arg + 0x88) = 0;
      result = NNG_ECONNRESET;
    }
    nni_mtx_unlock(mtx);
    nni_aio_finish_error(aio,result);
    return;
  }
  msg = *(nni_msg **)((long)arg + 0x70);
  if (*(long *)((long)arg + 0x60) == 0) {
    if (msg == (nni_msg *)0x0) goto LAB_00121592;
  }
  else if (msg == (nni_msg *)0x0) {
    _Var2 = nni_aio_start(aio,req0_ctx_cancel_recv,arg);
    if (_Var2) {
      *(nni_aio **)((long)arg + 0x50) = aio;
    }
    nni_mtx_unlock(mtx);
    return;
  }
  *(undefined8 *)((long)arg + 0x70) = 0;
  nni_aio_set_msg(aio,msg);
  if ((void *)(lVar1 + 0x10) == arg) {
    nni_pollable_clear((nni_pollable *)(lVar1 + 0x330));
  }
  nni_mtx_unlock(mtx);
  count = nni_msg_len(msg);
  nni_aio_finish(aio,NNG_OK,count);
  return;
}

Assistant:

static void
req0_ctx_recv(void *arg, nni_aio *aio)
{
	req0_ctx  *ctx = arg;
	req0_sock *s   = ctx->sock;
	nni_msg   *msg;

	nni_mtx_lock(&s->mtx);
	if ((ctx->recv_aio != NULL) ||
	    ((ctx->req_msg == NULL) && (ctx->rep_msg == NULL))) {
		// We have already got a pending receive or have not
		// tried to send a request yet.
		// Either of these violate our basic state assumptions.
		int rv;
		if (ctx->conn_reset) {
			ctx->conn_reset = false;
			rv              = NNG_ECONNRESET;
		} else {
			rv = NNG_ESTATE;
		}
		nni_mtx_unlock(&s->mtx);
		nni_aio_finish_error(aio, rv);
		return;
	}

	if ((msg = ctx->rep_msg) == NULL) {
		if (!nni_aio_start(aio, req0_ctx_cancel_recv, ctx)) {
			nni_mtx_unlock(&s->mtx);
			return;
		}
		ctx->recv_aio = aio;
		nni_mtx_unlock(&s->mtx);
		return;
	}

	ctx->rep_msg = NULL;

	// We have got a message to pass up, yay!
	nni_aio_set_msg(aio, msg);
	if (ctx == &s->master) {
		nni_pollable_clear(&s->readable);
	}
	nni_mtx_unlock(&s->mtx);
	nni_aio_finish(aio, 0, nni_msg_len(msg));
}